

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkCreateCone(Abc_Ntk_t *pNtk,Abc_Obj_t *pNode,char *pNodeName,int fUseAllCis)

{
  Abc_NtkType_t Type;
  int *piVar1;
  void **ppvVar2;
  uint uVar3;
  int iVar4;
  Abc_Ntk_t *pNtk_00;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *pVVar8;
  Abc_Obj_t *pAVar9;
  long lVar10;
  long lVar11;
  char Buffer [1000];
  Abc_Obj_t *local_428;
  char *local_420;
  char local_418 [1000];
  
  Type = pNtk->ntkType;
  local_428 = pNode;
  if ((Type & ~ABC_NTK_NETLIST) != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                  ,0x36e,"Abc_Ntk_t *Abc_NtkCreateCone(Abc_Ntk_t *, Abc_Obj_t *, char *, int)");
  }
  uVar3 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar3 != 7) {
    if (Type == ABC_NTK_STRASH) {
      if (**(int **)((ulong)pNode & 0xfffffffffffffffe) != 3) {
        __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                      ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
      }
      if ((((*(uint *)((long)((ulong)pNode & 0xfffffffffffffffe) + 0x14) & 0xf) == 1) ||
          (uVar3 == 2)) || (uVar3 == 5)) goto LAB_0087b6f3;
    }
    __assert_fail("Abc_ObjIsNode(pNode) || (Abc_NtkIsStrash(pNtk) && (Abc_AigNodeIsConst(pNode) || Abc_ObjIsCi(pNode)))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                  ,0x36f,"Abc_Ntk_t *Abc_NtkCreateCone(Abc_Ntk_t *, Abc_Obj_t *, char *, int)");
  }
LAB_0087b6f3:
  pNtk_00 = Abc_NtkAlloc(Type,pNtk->ntkFunc,1);
  local_420 = pNodeName;
  sprintf(local_418,"%s_%s",pNtk->pName,pNodeName);
  pcVar5 = Extra_UtilStrsav(local_418);
  pNtk_00->pName = pcVar5;
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pAVar6 = Abc_AigConst1(pNtk_00);
    pAVar7 = Abc_AigConst1(pNtk);
    (pAVar7->field_6).pCopy = pAVar6;
  }
  __ptr = Abc_NtkDfsNodes(pNtk,&local_428,1);
  pVVar8 = pNtk->vCis;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      pAVar6 = (Abc_Obj_t *)pVVar8->pArray[lVar10];
      if (fUseAllCis == 0) {
        iVar4 = Abc_NodeIsTravIdCurrent(pAVar6);
        if (iVar4 != 0) goto LAB_0087b789;
      }
      else {
LAB_0087b789:
        pAVar7 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
        (pAVar6->field_6).pCopy = pAVar7;
        pcVar5 = Abc_ObjName(pAVar6);
        Abc_ObjAssignName(pAVar7,pcVar5,(char *)0x0);
      }
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vCis;
    } while (lVar10 < pVVar8->nSize);
  }
  pAVar6 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
  Abc_ObjAssignName(pAVar6,local_420,(char *)0x0);
  if (0 < __ptr->nSize) {
    lVar10 = 0;
    do {
      pAVar7 = (Abc_Obj_t *)__ptr->pArray[lVar10];
      if (pNtk->ntkType == ABC_NTK_STRASH) {
        piVar1 = (pAVar7->vFanins).pArray;
        ppvVar2 = pAVar7->pNtk->vObjs->pArray;
        pAVar9 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)&pAVar7->field_0x14 >> 10 & 1) ^
                            *(ulong *)((long)ppvVar2[*piVar1] + 0x40)),
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)&pAVar7->field_0x14 >> 0xb & 1) ^
                            *(ulong *)((long)ppvVar2[piVar1[1]] + 0x40)));
        (pAVar7->field_6).pCopy = pAVar9;
      }
      else {
        Abc_NtkDupObj(pNtk_00,pAVar7,0);
        if (0 < (pAVar7->vFanins).nSize) {
          lVar11 = 0;
          do {
            Abc_ObjAddFanin((pAVar7->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[lVar11]] +
                             0x40));
            lVar11 = lVar11 + 1;
          } while (lVar11 < (pAVar7->vFanins).nSize);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < __ptr->nSize);
  }
  Abc_ObjAddFanin(pAVar6,(local_428->field_6).pCopy);
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  iVar4 = Abc_NtkCheck(pNtk_00);
  if (iVar4 == 0) {
    fwrite("Abc_NtkCreateCone(): Network check has failed.\n",0x2f,1,_stdout);
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateCone( Abc_Ntk_t * pNtk, Abc_Obj_t * pNode, char * pNodeName, int fUseAllCis )
{
    Abc_Ntk_t * pNtkNew; 
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanin, * pNodeCoNew;
    char Buffer[1000];
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk) );
    assert( Abc_ObjIsNode(pNode) || (Abc_NtkIsStrash(pNtk) && (Abc_AigNodeIsConst(pNode) || Abc_ObjIsCi(pNode)))  ); 
    
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // set the name
    sprintf( Buffer, "%s_%s", pNtk->pName, pNodeName );
    pNtkNew->pName = Extra_UtilStrsav(Buffer);

    // establish connection between the constant nodes
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);

    // collect the nodes in the TFI of the output (mark the TFI)
    vNodes = Abc_NtkDfsNodes( pNtk, &pNode, 1 );
    // create the PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( fUseAllCis || Abc_NodeIsTravIdCurrent(pObj) ) // TravId is set by DFS
        {
            pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
        }
    }
    // add the PO corresponding to this output
    pNodeCoNew = Abc_NtkCreatePo( pNtkNew );
    Abc_ObjAssignName( pNodeCoNew, pNodeName, NULL );
    // copy the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        // if it is an AIG, add to the hash table
        if ( Abc_NtkIsStrash(pNtk) )
        {
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
        }
        else
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }
    }
    // connect the internal nodes to the new CO
    Abc_ObjAddFanin( pNodeCoNew, pNode->pCopy );
    Vec_PtrFree( vNodes );

    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateCone(): Network check has failed.\n" );
    return pNtkNew;
}